

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O0

void __thiscall slang::IntervalMapDetails::Path::moveRight(Path *this,uint32_t level)

{
  reference pEVar1;
  uint32_t offset;
  uint in_ESI;
  NodeRef in_RDI;
  NodeRef nodeRef;
  uint32_t l;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  void *local_40;
  undefined8 local_38;
  void *local_28;
  undefined8 local_20;
  uint local_10;
  
  local_10 = in_ESI - 1;
  while( true ) {
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
    if (local_10 != 0) {
      pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                         ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                          in_RDI.pip.value,(ulong)local_10);
      in_stack_ffffffffffffffa8 = pEVar1->offset;
      pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                         ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                          in_RDI.pip.value,(ulong)local_10);
      in_stack_ffffffffffffffac =
           CONCAT13(in_stack_ffffffffffffffa8 == pEVar1->size - 1,(int3)in_stack_ffffffffffffffac);
    }
    if ((char)(in_stack_ffffffffffffffac >> 0x18) == '\0') break;
    local_10 = local_10 - 1;
  }
  pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                     ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)in_RDI.pip.value,
                      (ulong)local_10);
  offset = pEVar1->offset + 1;
  pEVar1->offset = offset;
  pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                     ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)in_RDI.pip.value,
                      (ulong)local_10);
  if (offset != pEVar1->size) {
    childAt((Path *)in_RDI.pip.value,in_stack_ffffffffffffffac);
    while (local_10 = local_10 + 1, local_10 != in_ESI) {
      Entry::Entry((Entry *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI,
                   offset);
      pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                         ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                          in_RDI.pip.value,(ulong)local_10);
      pEVar1->node = local_28;
      pEVar1->size = (undefined4)local_20;
      pEVar1->offset = local_20._4_4_;
      NodeRef::childAt((NodeRef *)CONCAT44(offset,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    }
    Entry::Entry((Entry *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI,
                 offset);
    pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                       ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)in_RDI.pip.value,
                        (ulong)local_10);
    pEVar1->node = local_40;
    pEVar1->size = (undefined4)local_38;
    pEVar1->offset = local_38._4_4_;
  }
  return;
}

Assistant:

void Path::moveRight(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go right.
    uint32_t l = level - 1;
    while (l && path[l].offset == path[l].size - 1)
        --l;

    // If we hit the end we've gone as far as we can.
    if (++path[l].offset == path[l].size)
        return;

    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, 0);
        nodeRef = nodeRef.childAt(0);
    }
    path[l] = Entry(nodeRef, 0);
}